

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_segment.hpp
# Opt level: O0

Elf_Half __thiscall
ELFIO::segment_impl<ELFIO::Elf32_Phdr>::add_section_index
          (segment_impl<ELFIO::Elf32_Phdr> *this,Elf_Half sec_index,Elf_Xword addr_align)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  size_type sVar3;
  ulong local_20;
  Elf_Xword addr_align_local;
  segment_impl<ELFIO::Elf32_Phdr> *psStack_10;
  Elf_Half sec_index_local;
  segment_impl<ELFIO::Elf32_Phdr> *this_local;
  
  local_20 = addr_align;
  addr_align_local._6_2_ = sec_index;
  psStack_10 = this;
  std::vector<unsigned_short,std::allocator<unsigned_short>>::emplace_back<unsigned_short&>
            ((vector<unsigned_short,std::allocator<unsigned_short>> *)&this->sections,
             (unsigned_short *)((long)&addr_align_local + 6));
  uVar1 = local_20;
  iVar2 = (*(this->super_segment)._vptr_segment[7])();
  if (CONCAT44(extraout_var,iVar2) < uVar1) {
    (*(this->super_segment)._vptr_segment[8])(this,&local_20);
  }
  sVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->sections);
  return (Elf_Half)sVar3;
}

Assistant:

Elf_Half add_section_index( Elf_Half  sec_index,
                                Elf_Xword addr_align ) override
    {
        sections.emplace_back( sec_index );
        if ( addr_align > get_align() ) {
            set_align( addr_align );
        }

        return (Elf_Half)sections.size();
    }